

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::AppendCustomDepend
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,cmCustomCommandGenerator *ccg)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  pointer inName;
  string dep;
  value_type local_50;
  
  pvVar2 = cmCustomCommandGenerator::GetDepends_abi_cxx11_(ccg);
  inName = (pvVar2->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    pvVar2 = cmCustomCommandGenerator::GetDepends_abi_cxx11_(ccg);
    if (inName == (pvVar2->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) break;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    bVar1 = cmLocalGenerator::GetRealDependency
                      ((cmLocalGenerator *)this,inName,
                       &(this->super_cmLocalCommonGenerator).ConfigName,&local_50);
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(depends,&local_50);
    }
    std::__cxx11::string::~string((string *)&local_50);
    inName = inName + 1;
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendCustomDepend(
  std::vector<std::string>& depends, cmCustomCommandGenerator const& ccg)
{
  for (std::vector<std::string>::const_iterator d = ccg.GetDepends().begin();
       d != ccg.GetDepends().end(); ++d) {
    // Lookup the real name of the dependency in case it is a CMake target.
    std::string dep;
    if (this->GetRealDependency(*d, this->ConfigName, dep)) {
      depends.push_back(dep);
    }
  }
}